

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O1

anon_class_40_5_d6c92a71 *
qclab::qgates::lambda_QGate1<double>
          (anon_class_40_5_d6c92a71 *__return_storage_ptr__,Op op,SquareMatrix<double> *mat1,
          double *vector)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  
  if (mat1->size_ == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,mat1);
    pdVar5 = (mat1->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    dVar1 = *pdVar5;
    dVar2 = pdVar5[1];
    dVar3 = pdVar5[mat1->size_];
    dVar4 = (pdVar5 + 1)[mat1->size_];
    __return_storage_ptr__->vector = vector;
    __return_storage_ptr__->m11 = dVar1;
    __return_storage_ptr__->m12 = dVar3;
    __return_storage_ptr__->m21 = dVar2;
    __return_storage_ptr__->m22 = dVar4;
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = double]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }